

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

void __thiscall
pstore::exchange::import_ns::callbacks::callbacks
          (callbacks *this,shared_ptr<pstore::exchange::import_ns::context> *ctxt,
          unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
          *root)

{
  element_type *peVar1;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  *root_local;
  shared_ptr<pstore::exchange::import_ns::context> *ctxt_local;
  callbacks *this_local;
  
  std::shared_ptr<pstore::exchange::import_ns::context>::shared_ptr(&this->context_,ctxt);
  peVar1 = std::
           __shared_ptr_access<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::push(&peVar1->stack,root);
  return;
}

Assistant:

callbacks (std::shared_ptr<context> const & ctxt, std::unique_ptr<rule> && root)
                        : context_{ctxt} {
                    context_->stack.push (std::move (root));
                }